

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float *pfVar1;
  uint uVar2;
  float *pfVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (count != 0) {
    if (count == 1) {
      if (items->Width < 0.0) {
        return;
      }
      fVar5 = items->Width - width_excess;
      if (fVar5 <= 1.0) {
        fVar5 = 1.0;
      }
      items->Width = fVar5;
      return;
    }
    qsort(items,(long)count,0xc,ShrinkWidthItemComparer);
  }
  pfVar1 = &items->Width;
  uVar2 = 1;
  do {
    if ((count <= (int)uVar2) || (width_excess <= 0.0)) break;
    pfVar3 = pfVar1 + (long)(int)uVar2 * 3;
    do {
      fVar5 = *pfVar3;
      if (fVar5 < items->Width) {
        if (0.0 <= fVar5) {
          fVar5 = items->Width - fVar5;
          goto LAB_00213f16;
        }
        break;
      }
      uVar2 = uVar2 + 1;
      pfVar3 = pfVar3 + 3;
    } while (count != uVar2);
    fVar5 = items->Width + -1.0;
LAB_00213f16:
    if (0.0 < fVar5) {
      fVar6 = width_excess / (float)(int)uVar2;
      if (fVar5 <= fVar6) {
        fVar6 = fVar5;
      }
      if (0 < (int)uVar2) {
        lVar4 = 0;
        do {
          *(float *)((long)pfVar1 + lVar4) = *(float *)((long)pfVar1 + lVar4) - fVar6;
          lVar4 = lVar4 + 0xc;
        } while ((ulong)uVar2 * 0xc != lVar4);
      }
      width_excess = width_excess - fVar6 * (float)(int)uVar2;
    }
  } while (0.0 < fVar5);
  fVar5 = 0.0;
  if (0 < count) {
    lVar4 = 0;
    do {
      fVar6 = *(float *)((long)&items->Width + lVar4);
      fVar7 = (float)(int)fVar6;
      fVar5 = fVar5 + (fVar6 - fVar7);
      *(float *)((long)&items->Width + lVar4) = fVar7;
      lVar4 = lVar4 + 0xc;
    } while ((ulong)(uint)count * 0xc != lVar4);
  }
  if (0.0 < fVar5) {
    do {
      if ((0 < count) && (0.0 < fVar5)) {
        lVar4 = 1;
        pfVar3 = pfVar1;
        do {
          fVar6 = pfVar3[1] - *pfVar3;
          if (1.0 <= fVar6) {
            fVar6 = 1.0;
          }
          *pfVar3 = *pfVar3 + fVar6;
          fVar5 = fVar5 - fVar6;
          if (count <= lVar4) break;
          pfVar3 = pfVar3 + 3;
          lVar4 = lVar4 + 1;
        } while (0.0 < fVar5);
      }
    } while (0.0 < fVar5);
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count && width_excess > 0.0f; n++)
        {
            float width_to_add = ImMin(items[n].InitialWidth - items[n].Width, 1.0f);
            items[n].Width += width_to_add;
            width_excess -= width_to_add;
        }
}